

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

Vector2i __thiscall sf::priv::WindowImplX11::getPosition(WindowImplX11 *this)

{
  Window WVar1;
  bool bVar2;
  int iVar3;
  Atom AVar4;
  Window WVar5;
  Window WVar6;
  ulong uVar7;
  long lVar8;
  Display *pDVar9;
  uint *puVar10;
  int *piVar11;
  bool bVar12;
  bool bVar13;
  int yAbsRelToRoot;
  int xAbsRelToRoot;
  uint height;
  int xRelToRoot;
  undefined4 uStack_74;
  uint width;
  int yRelToRoot;
  undefined4 uStack_64;
  uint depth;
  uint borderWidth;
  Window root;
  Window child;
  
  pDVar9 = this->m_display;
  XTranslateCoordinates
            (pDVar9,this->m_window,
             *(undefined8 *)(*(long *)(pDVar9 + 0xe8) + 0x10 + (long)*(int *)(pDVar9 + 0xe0) * 0x80)
             ,0,0,&xAbsRelToRoot,&yAbsRelToRoot,&child);
  bVar2 = anon_unknown.dwarf_1b7f4f::WindowsImplX11Impl::ewmhSupported();
  if (bVar2) {
    lVar8 = 0;
    do {
      if (lVar8 + 0x20 == 0x80) goto LAB_0017b92d;
      bVar2 = operator==((String *)((anonymous_namespace)::WindowsImplX11Impl::wmAbsPosGood + lVar8)
                         ,(String *)(anonymous_namespace)::WindowsImplX11Impl::windowManagerName);
      lVar8 = lVar8 + 0x20;
    } while (!bVar2);
    uVar7 = (ulong)(uint)yAbsRelToRoot;
    goto LAB_0017bad3;
  }
LAB_0017b92d:
  WVar6 = this->m_window;
  pDVar9 = this->m_display;
  bVar2 = anon_unknown.dwarf_1b7f4f::WindowsImplX11Impl::ewmhSupported();
  if (bVar2) {
    std::__cxx11::string::string((string *)&root,"_NET_FRAME_EXTENTS",(allocator *)&xRelToRoot);
    AVar4 = getAtom((string *)&root,true);
    std::__cxx11::string::~string((string *)&root);
    if (AVar4 != 0) {
      puVar10 = &width;
      _width = (uint *)0x0;
      piVar11 = &yRelToRoot;
      iVar3 = XGetWindowProperty(pDVar9,WVar6,AVar4,0,4,0,6,(string *)&root,&height,
                                 (allocator *)&xRelToRoot,piVar11,puVar10);
      bVar2 = CONCAT44(uStack_74,xRelToRoot) != 4;
      bVar12 = CONCAT44(uStack_64,yRelToRoot) != 0;
      bVar13 = _width == (uint *)0x0;
      if ((bVar13 || (bVar12 || bVar2)) || ((height != 0x20 || root != 6) || iVar3 != 0)) {
        if (_width == (uint *)0x0) goto LAB_0017ba37;
      }
      else {
        piVar11 = (int *)(ulong)*_width;
        puVar10 = (uint *)(ulong)_width[4];
      }
      XFree();
      if ((!bVar13 && (!bVar12 && !bVar2)) && ((height == 0x20 && root == 6) && iVar3 == 0)) {
        xAbsRelToRoot = xAbsRelToRoot - (int)piVar11;
        uVar7 = (ulong)(uint)(yAbsRelToRoot - (int)puVar10);
        goto LAB_0017bad3;
      }
    }
  }
LAB_0017ba37:
  WVar6 = this->m_window;
  pDVar9 = this->m_display;
  WVar1 = *(Window *)(*(long *)(pDVar9 + 0xe8) + 0x10 + (long)*(int *)(pDVar9 + 0xe0) * 0x80);
  root = WVar1;
  while( true ) {
    WVar5 = anon_unknown.dwarf_1b7f4f::WindowsImplX11Impl::getParentWindow(pDVar9,WVar6);
    if (WVar5 == WVar1) break;
    WVar6 = anon_unknown.dwarf_1b7f4f::WindowsImplX11Impl::getParentWindow(this->m_display,WVar6);
    pDVar9 = this->m_display;
  }
  XGetGeometry(this->m_display,WVar6,&root,&xRelToRoot,&yRelToRoot,&width,&height,&borderWidth,
               &depth);
  uVar7 = (ulong)(uint)yRelToRoot;
  xAbsRelToRoot = xRelToRoot;
LAB_0017bad3:
  return (Vector2i)((ulong)(uint)xAbsRelToRoot | uVar7 << 0x20);
}

Assistant:

Vector2i WindowImplX11::getPosition() const
{
    using namespace WindowsImplX11Impl;

    // Get absolute position of our window relative to root window. This
    // takes into account all information that X11 has, including X11
    // border widths and any decorations. It corresponds to where the
    // window actually is, but not necessarily to where we told it to
    // go using setPosition() and XMoveWindow(). To have the two match
    // as expected, we may have to subtract decorations and borders.
    ::Window child;
    int xAbsRelToRoot, yAbsRelToRoot;

    XTranslateCoordinates(m_display, m_window, DefaultRootWindow(m_display),
        0, 0, &xAbsRelToRoot, &yAbsRelToRoot, &child);

    // CASE 1: some rare WMs actually put the window exactly where we tell
    // it to, even with decorations and such, which get shifted back.
    // In these rare cases, we can use the absolute value directly.
    if (isWMAbsolutePositionGood())
        return Vector2i(xAbsRelToRoot, yAbsRelToRoot);

    // CASE 2: most modern WMs support EWMH and can define _NET_FRAME_EXTENTS
    // with the exact frame size to subtract, so if present, we prefer it and
    // query it first. According to spec, this already includes any borders.
    long xFrameExtent, yFrameExtent;

    if (getEWMHFrameExtents(m_display, m_window, xFrameExtent, yFrameExtent))
    {
        // Get final X/Y coordinates: subtract EWMH frame extents from
        // absolute window position.
        return Vector2i((xAbsRelToRoot - static_cast<int>(xFrameExtent)), (yAbsRelToRoot - static_cast<int>(yFrameExtent)));
    }

    // CASE 3: EWMH frame extents were not available, use geometry.
    // We climb back up to the window before the root and use its
    // geometry information to extract X/Y position. This because
    // re-parenting WMs may re-parent the window multiple times, so
    // we'd have to climb up to the furthest ancestor and sum the
    // relative differences and borders anyway; and doing that to
    // subtract those values from the absolute coordinates of the
    // window is equivalent to going up the tree and asking the
    // furthest ancestor what it's relative distance to the root is.
    // So we use that approach because it's simpler.
    // This approach assumes that any window between the root and
    // our window is part of decorations/borders in some way. This
    // seems to hold true for most reasonable WM implementations.
    ::Window ancestor = m_window;
    ::Window root = DefaultRootWindow(m_display);

    while (getParentWindow(m_display, ancestor) != root)
    {
        // Next window up (parent window).
        ancestor = getParentWindow(m_display, ancestor);
    }

    // Get final X/Y coordinates: take the relative position to
    // the root of the furthest ancestor window.
    int xRelToRoot, yRelToRoot;
    unsigned int width, height, borderWidth, depth;

    XGetGeometry(m_display, ancestor, &root, &xRelToRoot, &yRelToRoot,
        &width, &height, &borderWidth, &depth);

    return Vector2i(xRelToRoot, yRelToRoot);
}